

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

xmlSchemaValPtr xmlSchemaCopyValue(xmlSchemaValPtr val)

{
  xmlChar *pxVar1;
  xmlSchemaValPtr pxVar2;
  xmlSchemaValPtr pxVar3;
  xmlSchemaValPtr value;
  xmlSchemaValPtr pxVar4;
  
  value = (xmlSchemaValPtr)0x0;
  pxVar4 = (xmlSchemaValPtr)0x0;
  for (; val != (xmlSchemaValPtr)0x0; val = val->next) {
    switch(val->type) {
    case XML_SCHEMAS_STRING:
    case XML_SCHEMAS_NORMSTRING:
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_ANYURI:
    case XML_SCHEMAS_HEXBINARY:
    case XML_SCHEMAS_BASE64BINARY:
    case XML_SCHEMAS_ANYSIMPLETYPE:
      pxVar3 = xmlSchemaDupVal(val);
      pxVar1 = (val->value).qname.name;
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(pxVar1);
        (pxVar3->value).qname.name = pxVar1;
      }
      break;
    default:
      pxVar3 = xmlSchemaDupVal(val);
      break;
    case XML_SCHEMAS_NMTOKENS:
    case XML_SCHEMAS_IDREFS:
    case XML_SCHEMAS_ENTITIES:
    case XML_SCHEMAS_ANYTYPE:
      xmlSchemaFreeValue(value);
      return (xmlSchemaValPtr)0x0;
    case XML_SCHEMAS_QNAME:
    case XML_SCHEMAS_NOTATION:
      pxVar3 = xmlSchemaDupVal(val);
      pxVar1 = (val->value).qname.name;
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(pxVar1);
        (pxVar3->value).qname.name = pxVar1;
      }
      pxVar1 = (val->value).qname.uri;
      if (pxVar1 != (xmlChar *)0x0) {
        pxVar1 = xmlStrdup(pxVar1);
        (pxVar3->value).qname.uri = pxVar1;
      }
    }
    pxVar2 = pxVar3;
    if (value != (xmlSchemaValPtr)0x0) {
      pxVar4->next = pxVar3;
      pxVar2 = value;
    }
    value = pxVar2;
    pxVar4 = pxVar3;
  }
  return value;
}

Assistant:

xmlSchemaValPtr
xmlSchemaCopyValue(xmlSchemaValPtr val)
{
    xmlSchemaValPtr ret = NULL, prev = NULL, cur;

    /*
    * Copy the string values.
    */
    while (val != NULL) {
	switch (val->type) {
	    case XML_SCHEMAS_ANYTYPE:
	    case XML_SCHEMAS_IDREFS:
	    case XML_SCHEMAS_ENTITIES:
	    case XML_SCHEMAS_NMTOKENS:
		xmlSchemaFreeValue(ret);
		return (NULL);
	    case XML_SCHEMAS_ANYSIMPLETYPE:
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_ENTITY:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_ANYURI:
		cur = xmlSchemaDupVal(val);
		if (val->value.str != NULL)
		    cur->value.str = xmlStrdup(BAD_CAST val->value.str);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		cur = xmlSchemaDupVal(val);
		if (val->value.qname.name != NULL)
		    cur->value.qname.name =
                    xmlStrdup(BAD_CAST val->value.qname.name);
		if (val->value.qname.uri != NULL)
		    cur->value.qname.uri =
                    xmlStrdup(BAD_CAST val->value.qname.uri);
		break;
	    case XML_SCHEMAS_HEXBINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.hex.str != NULL)
		    cur->value.hex.str = xmlStrdup(BAD_CAST val->value.hex.str);
		break;
	    case XML_SCHEMAS_BASE64BINARY:
		cur = xmlSchemaDupVal(val);
		if (val->value.base64.str != NULL)
		    cur->value.base64.str =
                    xmlStrdup(BAD_CAST val->value.base64.str);
		break;
	    default:
		cur = xmlSchemaDupVal(val);
		break;
	}
	if (ret == NULL)
	    ret = cur;
	else
	    prev->next = cur;
	prev = cur;
	val = val->next;
    }
    return (ret);
}